

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O1

void __thiscall GameData::InitNewGame(GameData *this)

{
  char cVar1;
  int iVar2;
  ifstream TempFile;
  istream local_210 [520];
  
  iVar2 = this->score;
  if (this->score < this->local_best) {
    iVar2 = this->local_best;
  }
  this->local_best = iVar2;
  *(int *)((long)(this->num + 0) + 0) = 0;
  *(int *)((long)(this->num + 0) + 4) = 0;
  *(int *)((long)(this->num + 0) + 8) = 0;
  *(int *)((long)(this->num + 0) + 0xc) = 0;
  *(int *)((long)(this->num + 1) + 0) = 0;
  *(int *)((long)(this->num + 1) + 4) = 0;
  *(int *)((long)(this->num + 1) + 8) = 0;
  *(int *)((long)(this->num + 1) + 0xc) = 0;
  *(int *)((long)(this->num + 2) + 0) = 0;
  *(int *)((long)(this->num + 2) + 4) = 0;
  *(int *)((long)(this->num + 2) + 8) = 0;
  *(int *)((long)(this->num + 2) + 0xc) = 0;
  *(int *)((long)(this->num + 3) + 0) = 0;
  *(int *)((long)(this->num + 3) + 4) = 0;
  *(int *)((long)(this->num + 3) + 8) = 0;
  *(int *)((long)(this->num + 3) + 0xc) = 0;
  MakeNewNumber(this);
  MakeNewNumber(this);
  std::ifstream::ifstream(local_210,"2048GAME.data",_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::operator>>(local_210,&this->my_best);
  }
  std::ifstream::close();
  this->score = 0;
  std::ifstream::~ifstream(local_210);
  return;
}

Assistant:

void GameData::InitNewGame() {
    local_best = std::max(local_best, score);
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            num[i][j] = 0;
    MakeNewNumber();
    MakeNewNumber();
    std::ifstream TempFile("2048GAME.data",std::ios::in | std::ios::binary);
    if(TempFile.is_open())
        TempFile>>my_best;
    TempFile.close();
    score = 0;
}